

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve.c
# Opt level: O2

void solvequeue(Item *q1,Item *q2,int blocktype,Item *qerr)

{
  List *pLVar1;
  int iVar2;
  Item *pIVar3;
  char *pcVar4;
  List *pLVar5;
  Item *pIVar6;
  
  if (solvq == (List *)0x0) {
    solvq = newlist();
  }
  if (blocktype == 0x130) {
    if (nrnstate == (List *)0x0) {
      nrnstate = newlist();
    }
    lappendstr(nrnstate,"{");
    if (qerr == (Item *)0x0) {
      pIVar6 = q1->prev;
      pIVar3 = q1;
      if (q2 != (Item *)0x0) {
        pIVar3 = q2;
      }
    }
    else {
      pIVar6 = q1->prev;
      pIVar3 = qerr;
    }
    movelist(pIVar6,pIVar3,nrnstate);
    lappendstr(nrnstate,"}");
  }
  pLVar1 = massage_list_;
  pLVar5 = massage_list_;
  if (massage_list_ != (List *)0x0) {
    while (pLVar5 = pLVar5->next, pLVar5 != pLVar1) {
      pcVar4 = ((pLVar5->element).sym)->name;
      iVar2 = strcmp(pcVar4,((q1->element).sym)->name);
      if (iVar2 == 0) {
        diag("The SOLVE statement must be before the DERIVATIVE block for ",pcVar4);
      }
    }
  }
  pIVar3 = lappendsym(solvq,(Symbol *)0x0);
  (pIVar3->element).itm = q1;
  pIVar3->itemtype = (short)blocktype;
  pIVar6 = q1->next;
  if ((pIVar6->itemtype == 1) &&
     (iVar2 = strcmp("STEADYSTATE",((pIVar6->element).sym)->name), iVar2 == 0)) {
    pIVar3->itemtype = -(short)blocktype;
  }
  if (q2 == (Item *)0x0) {
    lappendsym(solvq,(Symbol *)0x0);
  }
  else {
    pIVar6 = q2->next;
    lappendsym(solvq,(q2->element).sym);
    pcVar4 = ((q2->element).sym)->name;
    iVar2 = strcmp(pcVar4,"derivimplicit");
    if (iVar2 == 0) {
      add_deriv_imp_list(((q1->element).sym)->name);
      add_deriv_imp_really(((q1->element).sym)->name);
      pcVar4 = ((q2->element).sym)->name;
    }
    iVar2 = strcmp(pcVar4,"cnexp");
    if (iVar2 == 0) {
      pcVar4 = stralloc("derivimplicit",pcVar4);
      ((q2->element).sym)->name = pcVar4;
      add_deriv_imp_list(((q1->element).sym)->name);
      pcVar4 = ((q2->element).sym)->name;
      cvode_cnexp_solve = pIVar3;
    }
    iVar2 = strcmp(pcVar4,"euler");
    if (iVar2 == 0) {
      add_deriv_imp_really(((q1->element).sym)->name);
    }
    delete(q2->prev);
    delete(q2);
  }
  delete(q1->prev);
  if (qerr == (Item *)0x0) {
    pcVar4 = current_line();
    sprintf(buf,"if(error){fprintf(stderr,\"%s\\n\"); nrn_complain(_p); abort_run(error);}\n",pcVar4
           );
    qerr = insertstr(pIVar6,buf);
    pIVar6 = qerr;
  }
  else {
    replacstr(pIVar6,"if (error)");
  }
  pLVar5 = newlist();
  pIVar3 = lappendsym(solvq,(Symbol *)0x0);
  (pIVar3->element).lst = pLVar5;
  movelist(pIVar6,qerr,pLVar5);
  return;
}

Assistant:

void solvequeue(q1, q2, blocktype, qerr) /*solve NAME=q1 [using METHOD=q2]*/
				/* q2 = 0 means method wasn't there */
				/* qerr in ITEM0 or else the closing
				   brace of an IFERROR stmt */
	Item *q1, *q2, *qerr;
	int blocktype;
{
	/* the solvq list is organized in groups of an item element
	followed by the method symbol( null if default to be used) */
	/* The itemtype field of the first is used to carry the blocktype*/
	/* SOLVE and METHOD method are deleted */
	/* The list now consists of triples in which the third element
	   is a list containing the complete IFERROR statement.
	*/
	Item *lq, *qtemp;
	List *errstmt;

	if (!solvq) {
		solvq = newlist();
	}
#if NMODL
	/* if the blocktype is equation then move the solve statement to
		the nrnstate function.  Everything else stays in the
		model function to be used as the nrncurrent function */
	if (blocktype == BREAKPOINT) {
		if (!nrnstate) {
			nrnstate = newlist();
		}
		Lappendstr(nrnstate, "{");
		if (qerr) {
			movelist(q1->prev, qerr, nrnstate);
		}else if (q2) {
			movelist(q1->prev, q2, nrnstate);
		}else{
			movelist(q1->prev, q1, nrnstate);
		}
		Lappendstr(nrnstate, "}");
	}
	/* verify that the block defintion for this SOLVE has not yet been seen */
	if (massage_list_) ITERATE(lq, massage_list_) {
		if (strcmp(SYM(lq)->name, SYM(q1)->name) == 0) {
diag("The SOLVE statement must be before the DERIVATIVE block for ", SYM(lq)->name);
		}
	}
#endif
	lq = lappendsym(solvq, SYM0);
	ITM(lq) = q1;
	lq->itemtype = blocktype;
	/* handle STEADYSTATE option */
	if (q1->next->itemtype == SYMBOL &&
	    strcmp("STEADYSTATE", SYM(q1->next)->name) == 0) {
		lq->itemtype = -blocktype; /* gets put back below */
	}
	if (q2) {
		qtemp = q2->next;	/* The IFERROR location */
		Lappendsym(solvq, SYM(q2));
		if (strcmp(SYM(q2)->name, "derivimplicit") == 0) {
			add_deriv_imp_list(SYM(q1)->name);
			add_deriv_imp_really(SYM(q1)->name);
		}
		if (strcmp(SYM(q2)->name, "cnexp") == 0) {
			SYM(q2)->name = stralloc("derivimplicit", SYM(q2)->name);
			add_deriv_imp_list(SYM(q1)->name);
#if CVODE
			cvode_cnexp_solve = lq;
#endif
		}
        // state functions for euler should be non-staic
        // deriv_imp_really list is used to track those functions
		if (strcmp(SYM(q2)->name, "euler") == 0) {
			add_deriv_imp_really(SYM(q1)->name);
		}
		delete(q2->prev);
		delete(q2);
	}else{
		qtemp = q1->next;
		Lappendsym(solvq, SYM0);
	}
	delete(q1->prev);

	/* handle the error statement */
	/* put one in if it isn't already there */
	if (qerr == ITEM0) {
#if NOCMODL
sprintf(buf, "if(error){fprintf(stderr,\"%s\\n\"); nrn_complain(_p); abort_run(error);}\n",
current_line());
		qtemp = qerr = insertstr(qtemp, buf);
#else
		qtemp = qerr = insertstr(qtemp,
"if(error){abort_run(error);}\n");
#endif
	}else{
		replacstr(qtemp, "if (error)");
	}
	errstmt = newlist();
	lq = lappendsym(solvq, SYM0);
	LST(lq) = errstmt;
	movelist(qtemp, qerr, errstmt);		
}